

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall sptk::reaper::EpochTracker::GetResidualPulses(EpochTracker *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pfVar6;
  pointer pfVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  size_t i;
  long lVar11;
  ResidPeak p;
  ResidPeak local_a0;
  
  fVar1 = this->sample_rate_;
  fVar2 = this->peak_delay_;
  fVar3 = this->skew_delay_;
  pfVar4 = (this->norm_residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar5 = (this->norm_residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  ::resize(&this->resid_peaks_,0);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->peaks_debug_,
             (long)(this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  pfVar6 = (this->peaks_debug_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar7 = (this->peaks_debug_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar11 = 0; (long)pfVar7 - (long)pfVar6 >> 2 != lVar11; lVar11 = lVar11 + 1) {
    pfVar6[lVar11] = 0.0;
  }
  iVar8 = (int)(fVar2 * fVar1 + 0.5);
  lVar9 = (long)iVar8;
  lVar11 = (long)(int)(fVar1 * fVar3 + 0.5);
  for (lVar10 = 0; lVar9 + lVar10 < (long)((int)((ulong)((long)pfVar4 - (long)pfVar5) >> 2) - iVar8)
      ; lVar10 = lVar10 + 1) {
    pfVar6 = (this->norm_residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar1 = pfVar6[lVar9 + lVar10];
    if ((((fVar1 <= -1.0) && (fVar1 < pfVar6[lVar9 + lVar10 + -1])) &&
        (fVar1 <= pfVar6[lVar9 + lVar10 + 1])) &&
       ((fVar1 <= pfVar6[lVar10] && (fVar1 <= pfVar6[lVar10 + lVar9 * 2])))) {
      local_a0.past.
      super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.past.
      super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.future.
      super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.past.
      super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.future.
      super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.future.
      super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.nccf_periods.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.nccf_periods.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.nccf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.nccf_periods.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.nccf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.nccf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.resid_index = iVar8 + (int)lVar10;
      local_a0.frame_index =
           (int32_t)(((float)local_a0.resid_index / this->sample_rate_) /
                     this->internal_frame_interval_ + 0.5);
      if (this->n_feature_frames_ <= local_a0.frame_index) {
        local_a0.frame_index = this->n_feature_frames_ + -1;
      }
      local_a0.peak_quality =
           ((pfVar6[lVar10] + pfVar6[lVar10 + lVar9 * 2]) * 0.5 - fVar1) * this->peak_prominence_wt_
           + (-(pfVar6[(lVar9 + lVar10) - lVar11] - pfVar6[lVar9 + lVar11 + lVar10]) *
              this->peak_skew_wt_ - fVar1 * this->peak_val_wt_);
      if (local_a0.peak_quality < this->peak_quality_floor_) {
        local_a0.peak_quality = this->peak_quality_floor_;
      }
      std::
      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ::push_back(&this->resid_peaks_,&local_a0);
      (this->peaks_debug_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9 + lVar10] = local_a0.peak_quality;
      ResidPeak::~ResidPeak(&local_a0);
    }
  }
  return;
}

Assistant:

void EpochTracker::GetResidualPulses(void) {
  int32_t peak_ind = RoundUp(peak_delay_ * sample_rate_);
  int32_t skew_ind = RoundUp(skew_delay_ * sample_rate_);
  float min_peak = -1.0;  // minimum value that will be considered as a peak
  int32_t limit = norm_residual_.size() - peak_ind;
  resid_peaks_.resize(0);
  peaks_debug_.resize(residual_.size());
  for (size_t i = 0; i < peaks_debug_.size(); ++i) {
    peaks_debug_[i] = 0.0;
  }
  for (int32_t i = peak_ind; i < limit; ++i) {
    float val = norm_residual_[i];
    if (val > min_peak) {
      continue;
    }
    if ((norm_residual_[i-1] > val) && (val <= norm_residual_[i+1])) {
      float vm_peak = norm_residual_[i - peak_ind];
      float vp_peak = norm_residual_[i + peak_ind];
      if ((vm_peak < val) || (vp_peak < val)) {
        continue;
      }
      float vm_skew = norm_residual_[i - skew_ind];
      float vp_skew = norm_residual_[i + skew_ind];
      float sharp = (0.5 * (vp_peak + vm_peak)) - val;
      float skew = -(vm_skew - vp_skew);
      ResidPeak p;
      p.resid_index = i;
      float time = static_cast<float>(i) / sample_rate_;
      p.frame_index = RoundUp(time / internal_frame_interval_);
      if (p.frame_index >= n_feature_frames_) {
        p.frame_index = n_feature_frames_ - 1;
      }
      p.peak_quality = (-val * peak_val_wt_) + (skew * peak_skew_wt_) +
          (sharp * peak_prominence_wt_);
      if (p.peak_quality < peak_quality_floor_) {
        p.peak_quality = peak_quality_floor_;
      }
      resid_peaks_.push_back(p);
      peaks_debug_[i] = p.peak_quality;
    }
  }
}